

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unordered_map.h
# Opt level: O3

const_iterator __thiscall
frozen::
unordered_map<frozen::basic_string<char>,int,14ul,frozen::elsa<frozen::basic_string<char>>,std::equal_to<frozen::basic_string<char>>>
::find<frozen::basic_string<char>>
          (unordered_map<frozen::basic_string<char>,int,14ul,frozen::elsa<frozen::basic_string<char>>,std::equal_to<frozen::basic_string<char>>>
           *this,basic_string<char> *key)

{
  const_iterator this_00;
  const_iterator pvVar1;
  size_t sVar2;
  const_iterator pvVar3;
  size_t sVar4;
  
  this_00 = (const_iterator)(this + 0x150);
  sVar2 = bits::pmh_tables<32ul,frozen::elsa<frozen::basic_string<char>>>::
          lookup<frozen::basic_string<char>,frozen::elsa<frozen::basic_string<char>>>
                    ((pmh_tables<32ul,frozen::elsa<frozen::basic_string<char>>> *)this_00,key,
                     (elsa<frozen::basic_string<char>_> *)this_00);
  pvVar3 = this_00;
  if (sVar2 != 0xe) {
    pvVar1 = (const_iterator)(this + sVar2 * 0x18);
    sVar2 = key->size_;
    if (((pvVar1->first).size_ == sVar2) && (pvVar3 = pvVar1, sVar2 != 0)) {
      sVar4 = 0;
      do {
        if ((pvVar1->first).data_[sVar4] != key->data_[sVar4]) {
          return this_00;
        }
        sVar4 = sVar4 + 1;
      } while (sVar2 != sVar4);
    }
  }
  return pvVar3;
}

Assistant:

constexpr const_iterator find(KeyType const &key) const {
    return find_impl(*this, key, hash_function(), key_eq());
  }